

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O2

string * __thiscall
Sock::RecvUntilTerminator_abi_cxx11_
          (string *__return_storage_ptr__,Sock *this,uint8_t terminator,milliseconds timeout,
          CThreadInterrupt *interrupt,size_t max_data)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar4;
  ulong uVar5;
  undefined4 extraout_var;
  char *pcVar7;
  int extraout_var_00;
  int *piVar8;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar9;
  runtime_error *prVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  long *args_2;
  long in_FS_OFFSET;
  int in_stack_fffffffffffffd4c;
  ssize_t read_ret;
  ssize_t peek_ret;
  uint8_t terminator_local;
  size_t try_len;
  string local_258;
  char buf [512];
  char *pcVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = (long *)max_data;
  terminator_local = terminator;
  tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000l>>>>()
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    uVar11 = max_data - uVar5;
    if (max_data < uVar5 || uVar11 == 0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_258._M_dataplus._M_p = (pointer)__return_storage_ptr__->_M_string_length;
      tinyformat::format<unsigned_long>
                ((string *)buf,"Received too many bytes without a terminator (%u)",
                 (unsigned_long *)&local_258);
      std::runtime_error::runtime_error(prVar10,(string *)buf);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00af184a:
      __stack_chk_fail();
    }
    if (0x1ff < uVar11) {
      uVar11 = 0x200;
    }
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    iVar3 = (*this->_vptr_Sock[4])(this,buf,uVar11);
    pcVar6 = (char *)CONCAT44(extraout_var,iVar3);
    peek_ret = (ssize_t)pcVar6;
    if (pcVar6 == (char *)0xffffffffffffffff) {
      piVar8 = __errno_location();
      iVar3 = *piVar8;
      if (((iVar3 != 4) && (iVar3 != 0xb)) && (iVar3 != 0x73)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        SysErrorString_abi_cxx11_(in_stack_fffffffffffffd4c);
        tinyformat::format<std::__cxx11::string>
                  (&local_258,(tinyformat *)"recv(): %s",(char *)&try_len,args);
        std::runtime_error::runtime_error(prVar10,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00af184a;
      }
    }
    else {
      if (pcVar6 == (char *)0x0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Connection unexpectedly closed by peer");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00af184a;
      }
      pcVar12 = buf + (long)pcVar6;
      pcVar7 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                         (buf,pcVar12,&terminator_local);
      if (pcVar7 != pcVar12) {
        pcVar6 = pcVar7 + (1 - (long)buf);
      }
      try_len = (size_t)pcVar6;
      iVar3 = (*this->_vptr_Sock[4])(this,buf,pcVar6,0);
      read_ret = CONCAT44(extraout_var_00,iVar3);
      if ((extraout_var_00 < 0) || ((char *)read_ret != pcVar6)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<long,unsigned_long,long>
                  (&local_258,
                   (tinyformat *)
                   "recv() returned %u bytes on attempt to read %u bytes but previous peek claimed %u bytes are available"
                   ,(char *)&read_ret,(long *)&try_len,(unsigned_long *)&peek_ret,args_2);
        std::runtime_error::runtime_error(prVar10,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00af184a;
      }
      std::__cxx11::string::append<char*,void>
                ((string *)__return_storage_ptr__,buf,
                 buf + ((long)pcVar6 - (ulong)(pcVar7 != pcVar12)));
      if (pcVar7 != pcVar12) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return __return_storage_ptr__;
        }
        goto LAB_00af184a;
      }
    }
    tVar9 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                      ();
    lVar13 = ((long)tVar4.__d.__r + timeout.__r) - (long)tVar9.__d.__r;
    if (lVar13 == 0 || (long)tVar4.__d.__r + timeout.__r < (long)tVar9.__d.__r) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      try_len = __return_storage_ptr__->_M_string_length;
      tinyformat::format<unsigned_long>
                (&local_258,"Receive timeout (received %u bytes without terminator before that)",
                 &try_len);
      std::runtime_error::runtime_error(prVar10,(string *)&local_258);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00af184a;
    }
    bVar2 = CThreadInterrupt::operator_cast_to_bool(interrupt);
    if (bVar2) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      try_len = __return_storage_ptr__->_M_string_length;
      tinyformat::format<unsigned_long>
                (&local_258,"Receive interrupted (received %u bytes without terminator before that)"
                 ,&try_len);
      std::runtime_error::runtime_error(prVar10,(string *)&local_258);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00af184a;
    }
    if (999 < lVar13) {
      lVar13 = 1000;
    }
    (*this->_vptr_Sock[0xe])(this,lVar13,1,0);
    uVar5 = __return_storage_ptr__->_M_string_length;
  } while( true );
}

Assistant:

std::string Sock::RecvUntilTerminator(uint8_t terminator,
                                      std::chrono::milliseconds timeout,
                                      CThreadInterrupt& interrupt,
                                      size_t max_data) const
{
    const auto deadline = GetTime<std::chrono::milliseconds>() + timeout;
    std::string data;
    bool terminator_found{false};

    // We must not consume any bytes past the terminator from the socket.
    // One option is to read one byte at a time and check if we have read a terminator.
    // However that is very slow. Instead, we peek at what is in the socket and only read
    // as many bytes as possible without crossing the terminator.
    // Reading 64 MiB of random data with 262526 terminator chars takes 37 seconds to read
    // one byte at a time VS 0.71 seconds with the "peek" solution below. Reading one byte
    // at a time is about 50 times slower.

    for (;;) {
        if (data.size() >= max_data) {
            throw std::runtime_error(
                strprintf("Received too many bytes without a terminator (%u)", data.size()));
        }

        char buf[512];

        const ssize_t peek_ret{Recv(buf, std::min(sizeof(buf), max_data - data.size()), MSG_PEEK)};

        switch (peek_ret) {
        case -1: {
            const int err{WSAGetLastError()};
            if (IOErrorIsPermanent(err)) {
                throw std::runtime_error(strprintf("recv(): %s", NetworkErrorString(err)));
            }
            break;
        }
        case 0:
            throw std::runtime_error("Connection unexpectedly closed by peer");
        default:
            auto end = buf + peek_ret;
            auto terminator_pos = std::find(buf, end, terminator);
            terminator_found = terminator_pos != end;

            const size_t try_len{terminator_found ? terminator_pos - buf + 1 :
                                                    static_cast<size_t>(peek_ret)};

            const ssize_t read_ret{Recv(buf, try_len, 0)};

            if (read_ret < 0 || static_cast<size_t>(read_ret) != try_len) {
                throw std::runtime_error(
                    strprintf("recv() returned %u bytes on attempt to read %u bytes but previous "
                              "peek claimed %u bytes are available",
                              read_ret, try_len, peek_ret));
            }

            // Don't include the terminator in the output.
            const size_t append_len{terminator_found ? try_len - 1 : try_len};

            data.append(buf, buf + append_len);

            if (terminator_found) {
                return data;
            }
        }

        const auto now = GetTime<std::chrono::milliseconds>();

        if (now >= deadline) {
            throw std::runtime_error(strprintf(
                "Receive timeout (received %u bytes without terminator before that)", data.size()));
        }

        if (interrupt) {
            throw std::runtime_error(strprintf(
                "Receive interrupted (received %u bytes without terminator before that)",
                data.size()));
        }

        // Wait for a short while (or the socket to become ready for reading) before retrying.
        const auto wait_time = std::min(deadline - now, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
        (void)Wait(wait_time, RECV);
    }
}